

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# HighsSparseMatrix.cpp
# Opt level: O0

void __thiscall
HighsSparseMatrix::productTransposeQuad
          (HighsSparseMatrix *this,vector<double,_std::allocator<double>_> *result,
          vector<double,_std::allocator<double>_> *row,HighsInt debug_report)

{
  vector<double,_std::allocator<double>_> *this_00;
  bool bVar1;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> *this_01;
  const_reference pvVar2;
  const_reference pvVar3;
  reference this_02;
  reference pvVar4;
  vector<double,_std::allocator<double>_> *in_RDX;
  vector<double,_std::allocator<double>_> *in_RSI;
  HighsSparseMatrix *in_RDI;
  double dVar5;
  HighsInt iCol_1;
  HighsInt iEl_1;
  HighsInt iRow;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> value_1;
  HighsInt iEl;
  HighsCDouble value;
  HighsInt iCol;
  size_type in_stack_ffffffffffffff08;
  vector<double,_std::allocator<double>_> *in_stack_ffffffffffffff10;
  allocator_type *in_stack_ffffffffffffff18;
  value_type v;
  HighsCDouble *in_stack_ffffffffffffff20;
  undefined4 in_stack_ffffffffffffff28;
  undefined4 in_stack_ffffffffffffff2c;
  int iVar6;
  int local_90;
  int local_8c;
  int local_88;
  HighsCDouble local_70;
  vector<HighsCDouble,_std::allocator<HighsCDouble>_> local_60;
  int local_44;
  HighsCDouble local_40;
  int local_2c;
  undefined8 local_28;
  vector<double,_std::allocator<double>_> *local_18;
  vector<double,_std::allocator<double>_> *local_10;
  
  local_28 = 0;
  local_18 = in_RDX;
  local_10 = in_RSI;
  std::vector<double,_std::allocator<double>_>::assign
            (in_stack_ffffffffffffff10,in_stack_ffffffffffffff08,(value_type_conflict1 *)0x7ebe98);
  bVar1 = isColwise(in_RDI);
  if (bVar1) {
    for (local_2c = 0; local_2c < in_RDI->num_col_; local_2c = local_2c + 1) {
      HighsCDouble::HighsCDouble(&local_40,0.0);
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_2c);
      for (local_44 = *pvVar2; iVar6 = local_44,
          pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                             (&in_RDI->start_,(long)(local_2c + 1)), this_00 = local_18,
          iVar6 < *pvVar2; local_44 = local_44 + 1) {
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_44);
        std::vector<double,_std::allocator<double>_>::operator[](this_00,(long)*pvVar2);
        std::vector<double,_std::allocator<double>_>::operator[](&in_RDI->value_,(long)local_44);
        HighsCDouble::operator+=(in_stack_ffffffffffffff20,(double)in_stack_ffffffffffffff18);
      }
      dVar5 = HighsCDouble::operator_cast_to_double(&local_40);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_2c);
      *pvVar4 = dVar5;
    }
  }
  else {
    this_01 = (vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)(long)in_RDI->num_col_;
    HighsCDouble::HighsCDouble(&local_70,0.0);
    std::allocator<HighsCDouble>::allocator((allocator<HighsCDouble> *)0x7ec02a);
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::vector
              (this_01,CONCAT44(in_stack_ffffffffffffff2c,in_stack_ffffffffffffff28),
               in_stack_ffffffffffffff20,in_stack_ffffffffffffff18);
    std::allocator<HighsCDouble>::~allocator((allocator<HighsCDouble> *)0x7ec055);
    for (local_88 = 0; local_88 < in_RDI->num_row_; local_88 = local_88 + 1) {
      pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->start_,(long)local_88);
      local_8c = *pvVar2;
      while (iVar6 = local_8c,
            pvVar2 = std::vector<int,_std::allocator<int>_>::operator[]
                               (&in_RDI->start_,(long)(local_88 + 1)), iVar6 < *pvVar2) {
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[](local_18,(long)local_88);
        v = *pvVar3;
        pvVar3 = std::vector<double,_std::allocator<double>_>::operator[]
                           (&in_RDI->value_,(long)local_8c);
        in_stack_ffffffffffffff20 = (HighsCDouble *)(v * *pvVar3);
        pvVar2 = std::vector<int,_std::allocator<int>_>::operator[](&in_RDI->index_,(long)local_8c);
        std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                  (&local_60,(long)*pvVar2);
        HighsCDouble::operator+=(in_stack_ffffffffffffff20,v);
        local_8c = local_8c + 1;
      }
    }
    for (local_90 = 0; local_90 < in_RDI->num_col_; local_90 = local_90 + 1) {
      this_02 = std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::operator[]
                          (&local_60,(long)local_90);
      dVar5 = HighsCDouble::operator_cast_to_double(this_02);
      pvVar4 = std::vector<double,_std::allocator<double>_>::operator[](local_10,(long)local_90);
      *pvVar4 = dVar5;
    }
    std::vector<HighsCDouble,_std::allocator<HighsCDouble>_>::~vector
              ((vector<HighsCDouble,_std::allocator<HighsCDouble>_> *)in_stack_ffffffffffffff20);
  }
  return;
}

Assistant:

void HighsSparseMatrix::productTransposeQuad(
    vector<double>& result, const vector<double>& row,
    const HighsInt debug_report) const {
  assert(this->formatOk());
  assert((int)row.size() >= this->num_row_);
  result.assign(this->num_col_, 0.0);
  if (this->isColwise()) {
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++) {
      HighsCDouble value = 0.0;
      for (HighsInt iEl = this->start_[iCol]; iEl < this->start_[iCol + 1];
           iEl++)
        value += row[this->index_[iEl]] * this->value_[iEl];
      result[iCol] = double(value);
    }
  } else {
    std::vector<HighsCDouble> value(this->num_col_, 0);
    for (HighsInt iRow = 0; iRow < this->num_row_; iRow++) {
      for (HighsInt iEl = this->start_[iRow]; iEl < this->start_[iRow + 1];
           iEl++)
        value[this->index_[iEl]] += row[iRow] * this->value_[iEl];
    }
    for (HighsInt iCol = 0; iCol < this->num_col_; iCol++)
      result[iCol] = double(value[iCol]);
  }
}